

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O0

void __thiscall
btConeTwistConstraint::setParam(btConeTwistConstraint *this,int num,btScalar value,int axis)

{
  int axis_local;
  btScalar value_local;
  int num_local;
  btConeTwistConstraint *this_local;
  
  if (num - 1U < 2) {
    if ((axis < 0) || (2 < axis)) {
      this->m_biasFactor = value;
    }
    else {
      this->m_linERP = value;
      this->m_flags = this->m_flags | 2;
    }
  }
  else if (num - 3U < 2) {
    if ((axis < 0) || (2 < axis)) {
      this->m_angCFM = value;
      this->m_flags = this->m_flags | 4;
    }
    else {
      this->m_linCFM = value;
      this->m_flags = this->m_flags | 1;
    }
  }
  return;
}

Assistant:

void btConeTwistConstraint::setParam(int num, btScalar value, int axis)
{
	switch(num)
	{
		case BT_CONSTRAINT_ERP :
		case BT_CONSTRAINT_STOP_ERP :
			if((axis >= 0) && (axis < 3)) 
			{
				m_linERP = value;
				m_flags |= BT_CONETWIST_FLAGS_LIN_ERP;
			}
			else
			{
				m_biasFactor = value;
			}
			break;
		case BT_CONSTRAINT_CFM :
		case BT_CONSTRAINT_STOP_CFM :
			if((axis >= 0) && (axis < 3)) 
			{
				m_linCFM = value;
				m_flags |= BT_CONETWIST_FLAGS_LIN_CFM;
			}
			else
			{
				m_angCFM = value;
				m_flags |= BT_CONETWIST_FLAGS_ANG_CFM;
			}
			break;
		default:
			btAssertConstrParams(0);
			break;
	}
}